

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase::sectionEnded(CumulativeReporterBase *this,SectionStats *sectionStats)

{
  pointer pPVar1;
  SectionNode *pSVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  pPVar1 = (this->m_sectionStack).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pPVar1) {
    pSVar2 = pPVar1[-1].m_p;
    std::__cxx11::string::_M_assign((string *)&(pSVar2->stats).sectionInfo);
    std::__cxx11::string::_M_assign((string *)&(pSVar2->stats).sectionInfo.description);
    std::__cxx11::string::_M_assign((string *)&(pSVar2->stats).sectionInfo.lineInfo);
    (pSVar2->stats).sectionInfo.lineInfo.line = (sectionStats->sectionInfo).lineInfo.line;
    sVar3 = (sectionStats->assertions).failed;
    uVar4 = *(undefined8 *)((long)&(sectionStats->assertions).failed + 1);
    uVar5 = *(undefined8 *)((long)&sectionStats->durationInSeconds + 1);
    (pSVar2->stats).assertions.passed = (sectionStats->assertions).passed;
    (pSVar2->stats).assertions.failed = sVar3;
    *(undefined8 *)((long)&(pSVar2->stats).assertions.failed + 1) = uVar4;
    *(undefined8 *)((long)&(pSVar2->stats).durationInSeconds + 1) = uVar5;
    std::
    vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
    ::pop_back(&this->m_sectionStack);
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jjh13[P]sisl/test/../include/catch/catch.hpp"
                ,0xa66,
                "virtual void Catch::CumulativeReporterBase::sectionEnded(const SectionStats &)");
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }